

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O3

void getaddrinfo_cuncurrent_cb(uv_getaddrinfo_t *handle,int status,addrinfo *res)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long extraout_RDX;
  uv_getaddrinfo_t *puVar4;
  int *__ptr;
  
  __ptr = (int *)handle->data;
  piVar2 = callback_counts;
  puVar4 = (uv_getaddrinfo_t *)&closedir_req.bufsml[1].len;
  lVar3 = 0;
  do {
    puVar4 = puVar4 + 1;
    if (puVar4 == handle) goto LAB_0015b903;
    piVar2 = piVar2 + 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar3 = extraout_RDX;
LAB_0015b903:
  if (*__ptr == (int)lVar3) {
    *piVar2 = *piVar2 + 1;
    free(__ptr);
    uv_freeaddrinfo(res);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(__ptr,0);
  return;
}

Assistant:

static void getaddrinfo_cuncurrent_cb(uv_getaddrinfo_t* handle,
                                      int status,
                                      struct addrinfo* res) {
  int i;
  int* data = (int*)handle->data;

  for (i = 0; i < CONCURRENT_COUNT; i++) {
    if (&getaddrinfo_handles[i] == handle) {
      ASSERT(i == *data);

      callback_counts[i]++;
      break;
    }
  }
  ASSERT (i < CONCURRENT_COUNT);

  free(data);
  uv_freeaddrinfo(res);

  getaddrinfo_cbs++;
}